

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CLabelTable::DumpForUnreal(CLabelTable *this)

{
  uint uVar1;
  int iVar2;
  CDevicePage *pCVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  size_t sVar6;
  uint value;
  key_type *name;
  pointer __k;
  char *local_870;
  uint local_864;
  FILE *local_860;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  char ln [2048];
  
  local_860 = (FILE *)SJ_fopen((path *)Options::UnrealLabelListFName_abi_cxx11_,"w");
  if (local_860 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string
              ((string *)&order,(path *)Options::UnrealLabelListFName_abi_cxx11_);
    Error("opening file for write",
          (char *)order.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,FATAL);
    std::__cxx11::string::~string((string *)&order);
  }
  if (DeviceID == (char *)0x0) {
    uVar1 = 0x3fff;
  }
  else {
    pCVar3 = CDevice::GetPage(Device,0);
    uVar1 = pCVar3->Size - 1;
  }
  local_864 = 0xffff;
  if (Options::EmitVirtualLabels == '\0') {
    local_864 = uVar1;
  }
  getDumpOrder(&order,&this->symbols);
  for (__k = order.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != order.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::at(&this->symbols,__k);
    if ((int)pmVar4->page != 0xffffffff) {
      uVar1 = (int)pmVar4->page;
      if (Options::EmitVirtualLabels != '\0') {
        uVar1 = 0x7f80;
      }
      iVar2 = strcmp(DeviceID,"ZXSPECTRUM48");
      if ((iVar2 == 0) && ((int)uVar1 < 4)) {
        uVar1 = *(uint *)(&DAT_0015fa30 + (long)(int)uVar1 * 4);
      }
      value = pmVar4->value & local_864;
      pcVar5 = ln;
      if ((int)uVar1 < 0x7f00) {
        local_870 = ln;
        iVar2 = snprintf(ln,0x800,"%02d",(ulong)(uVar1 & 0xff));
        pcVar5 = local_870 + iVar2;
      }
      local_870 = pcVar5 + 1;
      *pcVar5 = ':';
      PrintHexAlt(&local_870,value);
      pcVar5 = local_870 + 1;
      *local_870 = ' ';
      local_870 = pcVar5;
      strcpy(pcVar5,(__k->_M_dataplus)._M_p);
      pcVar5 = local_870;
      sVar6 = strlen(local_870);
      (pcVar5 + sVar6)[0] = '\n';
      (pcVar5 + sVar6)[1] = '\0';
      fputs(ln,local_860);
    }
  }
  fclose(local_860);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&order);
  return;
}

Assistant:

void CLabelTable::DumpForUnreal() {
	char ln[LINEMAX], * ep;
	FILE* FP_UnrealList;
	if (!FOPEN_ISOK(FP_UnrealList, Options::UnrealLabelListFName, "w")) {
		Error("opening file for write", Options::UnrealLabelListFName.string().c_str(), FATAL);
	}
	const int PAGE_MASK = DeviceID ? Device->GetPage(0)->Size - 1 : 0x3FFF;
	const int ADR_MASK = Options::EmitVirtualLabels ? 0xFFFF : PAGE_MASK;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		int page = Options::EmitVirtualLabels ? LABEL_PAGE_OUT_OF_BOUNDS : symbol.page;
		if (!strcmp(DeviceID, "ZXSPECTRUM48") && page < 4) {	//TODO fix this properly?
			// convert pages {0, 1, 2, 3} of ZX48 into ZX128-like {ROM, 5, 2, 0}
			// this can be fooled when there were multiple devices used, Label doesn't know into
			// which device it does belong, so even ZX128 labels will be converted.
			const int fakeZx128Pages[] = {LABEL_PAGE_ROM, 5, 2, 0};
			page = fakeZx128Pages[page];
		}
		int lvalue = symbol.value & ADR_MASK;
		ep = ln;

		if (page < LABEL_PAGE_ROM) ep += SPRINTF1(ep, LINEMAX, "%02d", page&255);
		*(ep++) = ':';
		PrintHexAlt(ep, lvalue);

		*(ep++) = ' ';
		STRCPY(ep, LINEMAX-(ep-ln), name.c_str());
		STRCAT(ep, LINEMAX, "\n");
		fputs(ln, FP_UnrealList);
	}
	fclose(FP_UnrealList);
}